

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O0

int DummyWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  int iVar1;
  int *in_RSI;
  undefined8 *in_RDI;
  int Ret;
  DummyCompletionHandle Handle;
  
  (*(code *)*in_RDI)(*(undefined8 *)(in_RSI + 4),5,
                     "Waiting for completion of memory read to rank %d, condition %d\n",in_RSI[8],
                     *in_RSI);
  iVar1 = CMCondition_wait(*(undefined8 *)(in_RSI + 2),*in_RSI);
  if (iVar1 == 0) {
    (*(code *)*in_RDI)(*(undefined8 *)(in_RSI + 4),5,
                       "Remote memory read to rank %d with condition %d has FAILED because of writer failure\n"
                       ,in_RSI[8],*in_RSI);
  }
  else if (*in_RSI != -1) {
    (*(code *)*in_RDI)(*(undefined8 *)(in_RSI + 4),5,
                       "Remote memory read to rank %d with condition %d has completed\n",in_RSI[8],
                       *in_RSI);
  }
  free(in_RSI);
  return iVar1;
}

Assistant:

static int DummyWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    DummyCompletionHandle Handle = (DummyCompletionHandle)Handle_v;
    int Ret;
    Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                  "Waiting for completion of memory read to rank %d, condition %d\n", Handle->Rank,
                  Handle->CMcondition);
    /*
     * Wait for the CM condition to be signalled.  If it has been already,
     * this returns immediately.  Copying the incoming data to the waiting
     * buffer has been done by the reply handler.
     */
    Ret = CMCondition_wait(Handle->cm, Handle->CMcondition);
    if (!Ret)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Remote memory read to rank %d with "
                      "condition %d has FAILED because of "
                      "writer failure\n",
                      Handle->Rank, Handle->CMcondition);
    }
    else
    {
        if (Handle->CMcondition != -1)
            Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                          "Remote memory read to rank %d with condition %d has "
                          "completed\n",
                          Handle->Rank, Handle->CMcondition);
    }
    free(Handle);
    return Ret;
}